

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

float quick_select_float(float *arr,int n)

{
  float fVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float t_6;
  float t_5;
  float t_4;
  float t_3;
  float t_2;
  float t_1;
  float t;
  int hh;
  int ll;
  int middle;
  int median;
  int high;
  int low;
  int n_local;
  float *arr_local;
  
  median = 0;
  middle = n + -1;
  iVar2 = middle / 2;
  while( true ) {
    if (middle <= median) {
      return arr[iVar2];
    }
    if (middle == median + 1) break;
    iVar3 = (median + middle) / 2;
    if (arr[middle] <= arr[iVar3] && arr[iVar3] != arr[middle]) {
      fVar4 = arr[iVar3];
      arr[iVar3] = arr[middle];
      arr[middle] = fVar4;
    }
    if (arr[middle] <= arr[median] && arr[median] != arr[middle]) {
      fVar4 = arr[median];
      arr[median] = arr[middle];
      arr[middle] = fVar4;
    }
    if (arr[median] <= arr[iVar3] && arr[iVar3] != arr[median]) {
      fVar4 = arr[iVar3];
      arr[iVar3] = arr[median];
      arr[median] = fVar4;
    }
    fVar4 = arr[iVar3];
    arr[iVar3] = arr[median + 1];
    arr[median + 1] = fVar4;
    t = (float)(median + 1);
    t_1 = (float)middle;
    while( true ) {
      do {
        t = (float)((int)t + 1);
        fVar4 = t_1;
      } while (arr[(int)t] <= arr[median] && arr[median] != arr[(int)t]);
      do {
        t_1 = fVar4;
        fVar4 = (float)((int)t_1 + -1);
      } while (arr[median] <= arr[(int)fVar4] && arr[(int)fVar4] != arr[median]);
      if ((int)fVar4 < (int)t) break;
      fVar1 = arr[(int)t];
      arr[(int)t] = arr[(int)fVar4];
      arr[(int)fVar4] = fVar1;
      t_1 = fVar4;
    }
    fVar1 = arr[median];
    arr[median] = arr[(int)fVar4];
    arr[(int)fVar4] = fVar1;
    if ((int)fVar4 <= iVar2) {
      median = (int)t;
    }
    if (iVar2 <= (int)fVar4) {
      middle = (int)t_1 + -2;
    }
  }
  if (arr[middle] <= arr[median] && arr[median] != arr[middle]) {
    fVar4 = arr[median];
    arr[median] = arr[middle];
    arr[middle] = fVar4;
  }
  return arr[iVar2];
}

Assistant:

static float quick_select_float(float arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}